

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O2

void cov::timer::delay(time_unit unit,timer_t time)

{
  duration<long,_std::ratio<1L,_1000000000L>_> local_8;
  
  if (unit < (minute|micro_sec)) {
    local_8.__r = time;
    switch(unit) {
    case nano_sec:
      std::this_thread::sleep_for<long,std::ratio<1l,1000000000l>>(&local_8);
      break;
    case micro_sec:
      std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>
                ((duration<long,_std::ratio<1L,_1000000L>_> *)&local_8);
      break;
    case milli_sec:
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&local_8);
      break;
    case second:
      std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                ((duration<long,_std::ratio<1L,_1L>_> *)&local_8);
      break;
    case minute:
      std::this_thread::sleep_for<long,std::ratio<60l,1l>>
                ((duration<long,_std::ratio<60L,_1L>_> *)&local_8);
    }
  }
  return;
}

Assistant:

static void delay(time_unit unit, timer_t time)
		{
			switch (unit) {
			case time_unit::nano_sec:
				std::this_thread::sleep_for(std::chrono::nanoseconds(time));
				break;
			case time_unit::micro_sec:
				std::this_thread::sleep_for(std::chrono::microseconds(time));
				break;
			case time_unit::milli_sec:
				std::this_thread::sleep_for(std::chrono::milliseconds(time));
				break;
			case time_unit::second:
				std::this_thread::sleep_for(std::chrono::seconds(time));
				break;
			case time_unit::minute:
				std::this_thread::sleep_for(std::chrono::minutes(time));
				break;
			}
		}